

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void encode_message(upb_encstate *e,upb_Message *msg,upb_MiniTable *m,size_t *size)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  char *pcVar4;
  upb_MiniTableField *puVar5;
  char *data;
  upb_Extension *exts;
  upb_MiniTableField *field;
  long lVar6;
  size_t unknown_size;
  size_t ext_count;
  _upb_sortedmap local_60;
  char *local_50;
  char *local_48;
  size_t *local_40;
  size_t local_38;
  
  pcVar3 = e->ptr;
  pcVar4 = e->limit;
  if (((e->options & 4U) != 0) &&
     (bVar1 = m->required_count_dont_copy_me__upb_internal_use_only, bVar1 != 0)) {
    if (0x40 < bVar1) {
      __assert_fail("0 < n && n <= 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mini_table/internal/message.h"
                    ,0xb3,
                    "uint64_t _upb_MiniTable_RequiredMask_dont_copy_me__upb_internal_use_only(const struct upb_MiniTable *)"
                   );
    }
    if ((-1L << (bVar1 & 0x3f) | msg[1].field_0.internal_opaque) != 0xffffffffffffffff) {
      encode_err(e,kUpb_EncodeStatus_MissingRequired);
    }
  }
  if (((e->options & 2U) == 0) &&
     (data = upb_Message_GetUnknown(msg,(size_t *)&local_60), data != (char *)0x0)) {
    encode_bytes(e,data,CONCAT44(local_60.pos,local_60.start));
  }
  local_50 = pcVar4;
  local_48 = pcVar3;
  local_40 = size;
  if ((m->ext_dont_copy_me__upb_internal_use_only != '\0') &&
     (exts = _upb_Message_Getexts_dont_copy_me__upb_internal_use_only(msg,&local_38), local_38 != 0)
     ) {
    if ((e->options & 1) == 0) {
      lVar6 = local_38 * 0x18;
      do {
        encode_ext(e,exts,m->ext_dont_copy_me__upb_internal_use_only == '\x02');
        exts = exts + 1;
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != 0);
    }
    else {
      _upb_mapsorter_pushexts(&e->sorter,exts,local_38,&local_60);
      if (local_60.pos != local_60.end) {
        do {
          lVar6 = (long)local_60.pos;
          local_60.pos = local_60.pos + 1;
          encode_ext(e,(upb_Extension *)(e->sorter).entries[lVar6],
                     m->ext_dont_copy_me__upb_internal_use_only == '\x02');
        } while (local_60.pos != local_60.end);
      }
      (e->sorter).size = local_60.start;
    }
  }
  if (m->field_count_dont_copy_me__upb_internal_use_only != 0) {
    puVar5 = m->fields_dont_copy_me__upb_internal_use_only;
    lVar6 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only * 0xc;
    do {
      field = (upb_MiniTableField *)
              ((long)&puVar5[-1].number_dont_copy_me__upb_internal_use_only + lVar6);
      uVar2 = *(ushort *)((long)puVar5 + lVar6 + -6);
      if (uVar2 == 0) {
        (*(code *)(&DAT_00133d94 +
                  *(int *)(&DAT_00133d94 + (ulong)(*(byte *)((long)puVar5 + lVar6 + -1) >> 6) * 4)))
                  ();
        return;
      }
      if ((short)uVar2 < 1) {
        if (*(uint32_t *)((long)&msg->field_0 + (ulong)(uVar2 ^ 0xffff)) ==
            field->number_dont_copy_me__upb_internal_use_only) goto LAB_00120720;
      }
      else if ((*(byte *)((long)&msg->field_0 + (ulong)(uVar2 >> 3)) >> (uVar2 & 7) & 1) != 0) {
LAB_00120720:
        encode_field(e,msg,m->subs_dont_copy_me__upb_internal_use_only,field);
      }
      lVar6 = lVar6 + -0xc;
    } while (lVar6 != 0);
  }
  *local_40 = (long)(local_48 + (long)e->limit) - (long)(local_50 + (long)e->ptr);
  return;
}

Assistant:

static void encode_message(upb_encstate* e, const upb_Message* msg,
                           const upb_MiniTable* m, size_t* size) {
  size_t pre_len = e->limit - e->ptr;

  if (e->options & kUpb_EncodeOption_CheckRequired) {
    if (m->UPB_PRIVATE(required_count)) {
      if (!UPB_PRIVATE(_upb_Message_IsInitializedShallow)(msg, m)) {
        encode_err(e, kUpb_EncodeStatus_MissingRequired);
      }
    }
  }

  if ((e->options & kUpb_EncodeOption_SkipUnknown) == 0) {
    size_t unknown_size;
    const char* unknown = upb_Message_GetUnknown(msg, &unknown_size);

    if (unknown) {
      encode_bytes(e, unknown, unknown_size);
    }
  }

  if (m->UPB_PRIVATE(ext) != kUpb_ExtMode_NonExtendable) {
    /* Encode all extensions together. Unlike C++, we do not attempt to keep
     * these in field number order relative to normal fields or even to each
     * other. */
    size_t ext_count;
    const upb_Extension* ext =
        UPB_PRIVATE(_upb_Message_Getexts)(msg, &ext_count);
    if (ext_count) {
      if (e->options & kUpb_EncodeOption_Deterministic) {
        _upb_sortedmap sorted;
        _upb_mapsorter_pushexts(&e->sorter, ext, ext_count, &sorted);
        while (_upb_sortedmap_nextext(&e->sorter, &sorted, &ext)) {
          encode_ext(e, ext, m->UPB_PRIVATE(ext) == kUpb_ExtMode_IsMessageSet);
        }
        _upb_mapsorter_popmap(&e->sorter, &sorted);
      } else {
        const upb_Extension* end = ext + ext_count;
        for (; ext != end; ext++) {
          encode_ext(e, ext, m->UPB_PRIVATE(ext) == kUpb_ExtMode_IsMessageSet);
        }
      }
    }
  }

  if (upb_MiniTable_FieldCount(m)) {
    const upb_MiniTableField* f =
        &m->UPB_PRIVATE(fields)[m->UPB_PRIVATE(field_count)];
    const upb_MiniTableField* first = &m->UPB_PRIVATE(fields)[0];
    while (f != first) {
      f--;
      if (encode_shouldencode(e, msg, f)) {
        encode_field(e, msg, m->UPB_PRIVATE(subs), f);
      }
    }
  }

  *size = (e->limit - e->ptr) - pre_len;
}